

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::local_lu_map_t::local_lu_map_t
          (local_lu_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  uint uVar1;
  allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*> local_41;
  value_type local_40 [3];
  allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*> local_21;
  value_type local_20;
  clock_id_t local_18;
  loc_id_t local_14;
  clock_id_t clock_nb_local;
  loc_id_t loc_nb_local;
  local_lu_map_t *this_local;
  
  this->_loc_nb = 0;
  this->_clock_nb = 0;
  uVar1 = this->_loc_nb;
  local_20 = (value_type)0x0;
  local_18 = clock_nb;
  local_14 = loc_nb;
  _clock_nb_local = this;
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  allocator(&local_21);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_L,(ulong)uVar1,&local_20,&local_21);
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  ~allocator(&local_21);
  uVar1 = this->_loc_nb;
  local_40[0] = (value_type)0x0;
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  allocator(&local_41);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_U,(ulong)uVar1,local_40,&local_41);
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  ~allocator(&local_41);
  resize(this,local_14,local_18);
  return;
}

Assistant:

local_lu_map_t::local_lu_map_t(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
    : _loc_nb(0), _clock_nb(0), _L(_loc_nb, nullptr), _U(_loc_nb, nullptr)
{
  resize(loc_nb, clock_nb);
}